

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

uint * If_DsdObjHashLookup(If_DsdMan_t *p,int Type,int *pLits,int nLits,int truthId)

{
  uint *puVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar3 = nLits * 0x1fd3 + Type * 0x1ec1;
  if (nLits < 1) {
    uVar5 = 0;
  }
  else {
    uVar6 = 0;
    do {
      uVar3 = uVar3 + (&If_DsdObjHashKey_s_Primes)[(uint)uVar6 & 0xf] * pLits[uVar6];
      uVar6 = uVar6 + 1;
    } while ((uint)nLits != uVar6);
    uVar5 = nLits & 0xf;
  }
  if (Type == 6) {
    uVar3 = uVar3 + (&If_DsdObjHashKey_s_Primes)[uVar5] * truthId;
  }
  puVar1 = p->pBins + (ulong)uVar3 % (ulong)(uint)p->nBins;
  uVar3 = *puVar1;
  while( true ) {
    if (uVar3 == 0) {
      p->nUniqueMisses = p->nUniqueMisses + 1;
      return puVar1;
    }
    if (((int)uVar3 < 0) || ((p->vObjs).nSize <= (int)uVar3)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    piVar2 = (int *)(p->vObjs).pArray[uVar3];
    uVar3 = piVar2[1];
    if ((((uVar3 & 7) == Type) && (uVar3 >> 0x1b == nLits)) &&
       (iVar4 = bcmp(piVar2 + 2,pLits,(ulong)((uVar3 >> 0x1b) << 2)), iVar4 == 0)) {
      iVar4 = -1;
      if (0x17ffffff < uVar3 && (uVar3 & 7) == 6) {
        iVar4 = *piVar2;
        if (((long)iVar4 < 0) || ((p->vTruths).nSize <= iVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar4 = (p->vTruths).pArray[iVar4];
      }
      if (iVar4 == truthId) {
        p->nUniqueHits = p->nUniqueHits + 1;
        return puVar1;
      }
    }
    iVar4 = *piVar2;
    if (((long)iVar4 < 0) || ((p->vNexts).nSize <= iVar4)) break;
    puVar1 = (uint *)((p->vNexts).pArray + iVar4);
    uVar3 = *puVar1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

unsigned * If_DsdObjHashLookup( If_DsdMan_t * p, int Type, int * pLits, int nLits, int truthId )
{
    If_DsdObj_t * pObj;
    unsigned * pSpot = p->pBins + If_DsdObjHashKey(p, Type, pLits, nLits, truthId);
    for ( ; *pSpot; pSpot = (unsigned *)Vec_IntEntryP(&p->vNexts, pObj->Id) )
    {
        pObj = If_DsdVecObj( &p->vObjs, *pSpot );
        if ( If_DsdObjType(pObj) == Type && 
             If_DsdObjFaninNum(pObj) == nLits && 
             !memcmp(pObj->pFans, pLits, sizeof(int)*If_DsdObjFaninNum(pObj)) &&
             truthId == If_DsdObjTruthId(p, pObj) )
        {
            p->nUniqueHits++;
            return pSpot;
        }
    }
    p->nUniqueMisses++;
    return pSpot;
}